

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O1

void __thiscall
BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_long,_32U,_1U>_>::TestBody
          (BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_long,_32U,_1U>_>
           *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  value_type_conflict2 v;
  value_type bits;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  unsigned_long local_20 [2];
  
  local_20[1] = 1;
  local_20[0] = 0xfffffffeffffffff;
  local_30._M_head_impl = local_30._M_head_impl & 0xffffffffffffff00;
  local_48.data_ = local_48.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_40,"f1.value ()","static_cast<assign_type> (0U)",(bool *)&local_30,
             (bool *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_20[0] = local_20[0] | 0x100000000;
  local_30._M_head_impl._0_1_ = 1;
  local_48.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_40,"f1.value ()","static_cast<assign_type> (1U)",(bool *)&local_30,
             (bool *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_48.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_40,"pstore::bit_count::pop_count (v)","bits",(uint *)&local_48,local_20 + 1);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0x4d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_48.data_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_20[0] = local_20[0] | 0x100000000;
  local_48.data_ = (AssertHelperData *)0x1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_40,"static_cast<value_type> (f1)","v",(unsigned_long *)&local_48,
             (unsigned_long *)&local_30);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_48.data_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_48.data_ = (AssertHelperData *)0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_40,"vt","std::numeric_limits<value_type>::max ()",local_20,
             (unsigned_long *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0x51,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_48.data_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TYPED_TEST (BitFieldAssignment, Assignment) {
    using value_type = typename TypeParam::value_type;
    value_type const index = typename TypeParam::index ();
    value_type const bits = typename TypeParam::bits ();

    union {
        value_type vt;
        pstore::bit_field<value_type, index, bits> f1;
    };
    // set all of the bits to 1.
    vt = std::numeric_limits<value_type>::max ();
    // now blast values into f1.
    f1 = value_type{0};
    using assign_type = typename decltype (f1)::assign_type;
    EXPECT_EQ (f1.value (), static_cast<assign_type> (0U));
    f1 = value_type{1};
    EXPECT_EQ (f1.value (), static_cast<assign_type> (1U));
    constexpr auto v = decltype (f1)::max ();
    EXPECT_EQ (pstore::bit_count::pop_count (v), bits);
    f1 = v;
    // access the value of f1 by casting directly rather than using the value() member function.
    EXPECT_EQ (static_cast<value_type> (f1), v);
    EXPECT_EQ (vt, std::numeric_limits<value_type>::max ());
}